

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

PropertiesIteratorView __thiscall Rml::Element::IterateLocalProperties(Element *this)

{
  long lVar1;
  long in_RSI;
  PropertiesIterator *pPVar2;
  _Head_base<0UL,_Rml::PropertiesIterator_*,_false> _Var3;
  byte bVar4;
  __uniq_ptr_impl<Rml::PropertiesIterator,_std::default_delete<Rml::PropertiesIterator>_> local_70;
  PropertiesIterator local_68;
  
  bVar4 = 0;
  ElementStyle::Iterate(&local_68,(ElementStyle *)(*(long *)(in_RSI + 0x180) + 0x38));
  local_70._M_t.
  super__Tuple_impl<0UL,_Rml::PropertiesIterator_*,_std::default_delete<Rml::PropertiesIterator>_>.
  super__Head_base<0UL,_Rml::PropertiesIterator_*,_false>._M_head_impl =
       (tuple<Rml::PropertiesIterator_*,_std::default_delete<Rml::PropertiesIterator>_>)
       operator_new(0x58);
  pPVar2 = &local_68;
  _Var3._M_head_impl =
       (PropertiesIterator *)
       local_70._M_t.
       super__Tuple_impl<0UL,_Rml::PropertiesIterator_*,_std::default_delete<Rml::PropertiesIterator>_>
       .super__Head_base<0UL,_Rml::PropertiesIterator_*,_false>._M_head_impl;
  for (lVar1 = 0xb; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(_WordT *)_Var3._M_head_impl =
         (pPVar2->iterated_properties).defined_ids.super__Base_bitset<2UL>._M_w[0];
    pPVar2 = (PropertiesIterator *)((long)pPVar2 + (ulong)bVar4 * -0x10 + 8);
    _Var3._M_head_impl =
         (PropertiesIterator *)((_WordT *)((long)_Var3._M_head_impl + 8) + (ulong)bVar4 * -2);
  }
  PropertiesIteratorView::PropertiesIteratorView
            ((PropertiesIteratorView *)this,(UniquePtr<PropertiesIterator> *)&local_70);
  if ((_Tuple_impl<0UL,_Rml::PropertiesIterator_*,_std::default_delete<Rml::PropertiesIterator>_>)
      local_70._M_t.
      super__Tuple_impl<0UL,_Rml::PropertiesIterator_*,_std::default_delete<Rml::PropertiesIterator>_>
      .super__Head_base<0UL,_Rml::PropertiesIterator_*,_false>._M_head_impl !=
      (PropertiesIterator *)0x0) {
    operator_delete((void *)local_70._M_t.
                            super__Tuple_impl<0UL,_Rml::PropertiesIterator_*,_std::default_delete<Rml::PropertiesIterator>_>
                            .super__Head_base<0UL,_Rml::PropertiesIterator_*,_false>._M_head_impl,
                    0x58);
  }
  return (UniquePtr<PropertiesIterator>)(UniquePtr<PropertiesIterator>)this;
}

Assistant:

PropertiesIteratorView Element::IterateLocalProperties() const
{
	return PropertiesIteratorView(MakeUnique<PropertiesIterator>(meta->style.Iterate()));
}